

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# objectbox.hpp
# Opt level: O1

bool obx::anon_unknown_3::CollectingVisitorUniquePtr<objectbox::tsdemo::SensorValues>::visit
               (void *data,size_t size,void *userData)

{
  iterator __position;
  _Head_base<0UL,_objectbox::tsdemo::SensorValues_*,_false> local_20;
  
  if (userData != (void *)0x0) {
    local_20._M_head_impl = (SensorValues *)operator_new(0x48);
    (local_20._M_head_impl)->id = 0;
    (local_20._M_head_impl)->time = 0;
    (local_20._M_head_impl)->temperatureOutside = 0.0;
    (local_20._M_head_impl)->temperatureInside = 0.0;
    (local_20._M_head_impl)->temperatureCpu = 0.0;
    (local_20._M_head_impl)->loadCpu1 = 0.0;
    (local_20._M_head_impl)->loadCpu2 = 0.0;
    (local_20._M_head_impl)->loadCpu3 = 0.0;
    (local_20._M_head_impl)->loadCpu4 = 0.0;
    __position._M_current =
         *(unique_ptr<objectbox::tsdemo::SensorValues,_std::default_delete<objectbox::tsdemo::SensorValues>_>
           **)((long)userData + 8);
    if (__position._M_current ==
        *(unique_ptr<objectbox::tsdemo::SensorValues,_std::default_delete<objectbox::tsdemo::SensorValues>_>
          **)((long)userData + 0x10)) {
      std::
      vector<std::unique_ptr<objectbox::tsdemo::SensorValues,std::default_delete<objectbox::tsdemo::SensorValues>>,std::allocator<std::unique_ptr<objectbox::tsdemo::SensorValues,std::default_delete<objectbox::tsdemo::SensorValues>>>>
      ::_M_realloc_insert<objectbox::tsdemo::SensorValues*>
                ((vector<std::unique_ptr<objectbox::tsdemo::SensorValues,std::default_delete<objectbox::tsdemo::SensorValues>>,std::allocator<std::unique_ptr<objectbox::tsdemo::SensorValues,std::default_delete<objectbox::tsdemo::SensorValues>>>>
                  *)userData,__position,&local_20._M_head_impl);
    }
    else {
      ((__position._M_current)->_M_t).
      super___uniq_ptr_impl<objectbox::tsdemo::SensorValues,_std::default_delete<objectbox::tsdemo::SensorValues>_>
      ._M_t.
      super__Tuple_impl<0UL,_objectbox::tsdemo::SensorValues_*,_std::default_delete<objectbox::tsdemo::SensorValues>_>
      .super__Head_base<0UL,_objectbox::tsdemo::SensorValues_*,_false>._M_head_impl =
           local_20._M_head_impl;
      *(long *)((long)userData + 8) = *(long *)((long)userData + 8) + 8;
    }
    objectbox::tsdemo::SensorValues::_OBX_MetaInfo::fromFlatBuffer
              (data,size,*(SensorValues **)(*(long *)((long)userData + 8) + -8));
    return true;
  }
  __assert_fail("self",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/objectbox[P]objectbox-ts-demo/build_O1/_deps/objectbox-download-src/include/objectbox.hpp"
                ,0x449,
                "static bool obx::(anonymous namespace)::CollectingVisitorUniquePtr<objectbox::tsdemo::SensorValues>::visit(const void *, size_t, void *) [EntityT = objectbox::tsdemo::SensorValues]"
               );
}

Assistant:

static bool visit(const void* data, size_t size, void* userData) {
        CollectingVisitorUniquePtr<EntityT>* self = static_cast<CollectingVisitorUniquePtr<EntityT>*>(userData);
        assert(self);
        self->items.emplace_back(new EntityT());
        std::unique_ptr<EntityT>& ptrRef = self->items.back();
        EntityT::_OBX_MetaInfo::fromFlatBuffer(data, size, *ptrRef);
        return true;
    }